

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O1

CartesianPosition * ear::toCartesianPosition(PolarPosition position)

{
  CartesianPosition *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  
  dVar1 = sin(in_stack_00000008 * -0.017453292519943295);
  dVar2 = in_stack_00000010 * 0.017453292519943295;
  dVar3 = cos(dVar2);
  dVar4 = cos(in_stack_00000008 * -0.017453292519943295);
  dVar5 = cos(dVar2);
  dVar2 = sin(dVar2);
  in_RDI->X = dVar3 * dVar1 * in_stack_00000018;
  in_RDI->Y = dVar5 * dVar4 * in_stack_00000018;
  in_RDI->Z = dVar2 * in_stack_00000018;
  return in_RDI;
}

Assistant:

CartesianPosition toCartesianPosition(PolarPosition position) {
    auto cartesian = toCartesianVector3d(position);
    return CartesianPosition(cartesian[0], cartesian[1], cartesian[2]);
  }